

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

Script * cfd::GetLockingScriptFromUtxoData(UtxoData *utxo)

{
  byte bVar1;
  ulong uVar2;
  long in_RSI;
  Script *in_RDI;
  Descriptor desc;
  Script *locking_script;
  Script *this;
  Script local_220;
  string local_1e8 [360];
  Script local_80;
  string local_38 [39];
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  cfd::core::Script::Script(in_RDI,(Script *)(in_RSI + 0x50));
  cfd::core::Address::GetAddress_abi_cxx11_();
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_38);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      cfd::core::Descriptor::Parse(local_1e8,(vector *)(local_10 + 0x238));
      cfd::core::Descriptor::GetLockingScript();
      cfd::core::Script::operator=(this,&local_220);
      core::Script::~Script(this);
      core::Descriptor::~Descriptor((Descriptor *)0x3af8fc);
    }
  }
  else {
    cfd::core::Address::GetLockingScript();
    cfd::core::Script::operator=(this,&local_80);
    core::Script::~Script(this);
  }
  return in_RDI;
}

Assistant:

static Script GetLockingScriptFromUtxoData(const UtxoData& utxo) {
  Script locking_script = utxo.locking_script;
  if (!utxo.address.GetAddress().empty()) {
    locking_script = utxo.address.GetLockingScript();
  } else if (!utxo.descriptor.empty()) {
    auto desc = Descriptor::Parse(utxo.descriptor);
    locking_script = desc.GetLockingScript();
  }
  return locking_script;
}